

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

void pythonProcessingInstruction(void *user_data,xmlChar *target,xmlChar *data)

{
  int iVar1;
  PyObject *op;
  
  iVar1 = PyObject_HasAttrString(user_data,"processingInstruction");
  if (iVar1 != 0) {
    op = (PyObject *)_PyObject_CallMethod_SizeT(user_data,"processingInstruction","ss",target,data);
    _Py_XDECREF(op);
    return;
  }
  return;
}

Assistant:

static void
pythonProcessingInstruction(void *user_data,
                            const xmlChar * target, const xmlChar * data)
{
    PyObject *handler;
    PyObject *result;

#ifdef DEBUG_SAX
    printf("pythonProcessingInstruction(%s, %s) called\n", target, data);
#endif
    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "processingInstruction")) {
        result = PyObject_CallMethod(handler, (char *)
                                     "processingInstruction",
                                     (char *) "ss", target, data);
        Py_XDECREF(result);
    }
}